

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_16x8_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  code *pcVar2;
  code *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  bool bVar20;
  int8_t *piVar21;
  uint uVar22;
  undefined7 in_register_00000009;
  long lVar23;
  undefined8 *puVar24;
  int16_t *piVar25;
  undefined1 *puVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m256i buf2 [8];
  __m128i buf0 [16];
  __m128i buf1 [16];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  piVar21 = av1_fwd_txfm_shift_ls[8];
  uVar22 = (uint)CONCAT71(in_register_00000009,tx_type);
  bVar20 = false;
  if (uVar22 < 0x10) {
    if ((0x4110U >> (uVar22 & 0x1f) & 1) != 0) {
LAB_00472c80:
      lVar23 = 0x80;
      piVar25 = input;
      do {
        uVar17 = *(undefined8 *)(piVar25 + 4);
        *(undefined8 *)(local_280 + lVar23 + 0x10) = *(undefined8 *)piVar25;
        *(undefined8 *)(local_280 + lVar23 + 0x18) = uVar17;
        piVar25 = piVar25 + stride;
        lVar23 = lVar23 + -0x10;
      } while (lVar23 != 0);
      piVar25 = input + 8;
      lVar23 = 0xf0;
      do {
        uVar17 = *(undefined8 *)(piVar25 + 4);
        *(undefined8 *)(local_260 + lVar23) = *(undefined8 *)piVar25;
        *(undefined8 *)(local_260 + lVar23 + 8) = uVar17;
        lVar23 = lVar23 + -0x10;
        piVar25 = piVar25 + stride;
      } while (lVar23 != 0x70);
      goto LAB_00472cc8;
    }
    if ((0x80a0U >> (uVar22 & 0x1f) & 1) == 0) {
      if (uVar22 == 6) {
        bVar20 = true;
        goto LAB_00472c80;
      }
    }
    else {
      bVar20 = true;
    }
  }
  lVar23 = 0;
  piVar25 = input;
  do {
    uVar17 = *(undefined8 *)(piVar25 + 4);
    *(undefined8 *)(local_260 + lVar23) = *(undefined8 *)piVar25;
    *(undefined8 *)(local_260 + lVar23 + 8) = uVar17;
    lVar23 = lVar23 + 0x10;
    piVar25 = piVar25 + stride;
  } while (lVar23 != 0x80);
  piVar25 = input + 8;
  lVar23 = 0;
  do {
    uVar17 = *(undefined8 *)(piVar25 + 4);
    *(undefined8 *)(local_1e0 + lVar23) = *(undefined8 *)piVar25;
    *(undefined8 *)(local_1e0 + lVar23 + 8) = uVar17;
    lVar23 = lVar23 + 0x10;
    piVar25 = piVar25 + stride;
  } while (lVar23 != 0x80);
LAB_00472cc8:
  pcVar2 = *(code **)((long)col_txfm16x8_arr + (ulong)(uVar22 * 8));
  pcVar3 = *(code **)((long)row_txfm16x8_arr + (ulong)(uVar22 * 8));
  auVar5._16_16_ = auStack_250;
  auVar5._0_16_ = local_260;
  auVar6._16_16_ = local_240;
  auVar6._0_16_ = auStack_250;
  auVar7._16_16_ = auStack_230;
  auVar7._0_16_ = local_240;
  auVar8._16_16_ = local_220;
  auVar8._0_16_ = auStack_230;
  auVar12._16_16_ = auStack_1d0;
  auVar12._0_16_ = local_1e0;
  local_360 = vperm2f128_avx(auVar5,auVar12,0x20);
  auVar13._16_16_ = local_1c0;
  auVar13._0_16_ = auStack_1d0;
  local_340 = vperm2f128_avx(auVar6,auVar13,0x20);
  auVar14._16_16_ = auStack_1b0;
  auVar14._0_16_ = local_1c0;
  local_320 = vperm2i128_avx2(auVar7,auVar14,0x20);
  auVar15._16_16_ = local_1a0;
  auVar15._0_16_ = auStack_1b0;
  local_300 = vperm2f128_avx(auVar8,auVar15,0x20);
  auVar9._16_16_ = auStack_210;
  auVar9._0_16_ = local_220;
  auVar16._16_16_ = auStack_190;
  auVar16._0_16_ = local_1a0;
  local_2e0 = vperm2f128_avx(auVar9,auVar16,0x20);
  auVar10._16_16_ = local_200;
  auVar10._0_16_ = auStack_210;
  auVar18._16_16_ = local_180;
  auVar18._0_16_ = auStack_190;
  local_2c0 = vperm2f128_avx(auVar10,auVar18,0x20);
  auVar11._16_16_ = auStack_1f0;
  auVar11._0_16_ = local_200;
  auVar19._16_16_ = auStack_170;
  auVar19._0_16_ = local_180;
  local_2a0 = vperm2i128_avx2(auVar11,auVar19,0x20);
  local_280._0_16_ = ZEXT116(0) * auStack_170 + ZEXT116(1) * auStack_1f0;
  local_280._16_16_ = ZEXT116(0) * local_1e0 + ZEXT116(1) * auStack_170;
  bVar1 = *av1_fwd_txfm_shift_ls[8];
  uVar22 = (uint)(char)bVar1;
  if ((int)uVar22 < 0) {
    auVar28._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar28._2_2_ = auVar28._0_2_;
    auVar28._4_2_ = auVar28._0_2_;
    auVar28._6_2_ = auVar28._0_2_;
    auVar28._8_2_ = auVar28._0_2_;
    auVar28._10_2_ = auVar28._0_2_;
    auVar28._12_2_ = auVar28._0_2_;
    auVar28._14_2_ = auVar28._0_2_;
    auVar28._16_2_ = auVar28._0_2_;
    auVar28._18_2_ = auVar28._0_2_;
    auVar28._20_2_ = auVar28._0_2_;
    auVar28._22_2_ = auVar28._0_2_;
    auVar28._24_2_ = auVar28._0_2_;
    auVar28._26_2_ = auVar28._0_2_;
    auVar28._28_2_ = auVar28._0_2_;
    auVar28._30_2_ = auVar28._0_2_;
    lVar23 = 0;
    do {
      auVar5 = vpaddsw_avx2(auVar28,*(undefined1 (*) [32])(local_360 + lVar23));
      auVar5 = vpsraw_avx2(auVar5,ZEXT416(-uVar22));
      *(undefined1 (*) [32])(local_360 + lVar23) = auVar5;
      lVar23 = lVar23 + 0x20;
    } while (lVar23 != 0x100);
  }
  else if (bVar1 != 0) {
    lVar23 = 0;
    do {
      auVar5 = vpsllw_avx2(*(undefined1 (*) [32])(local_360 + lVar23),ZEXT416(uVar22));
      *(undefined1 (*) [32])(local_360 + lVar23) = auVar5;
      lVar23 = lVar23 + 0x20;
    } while (lVar23 != 0x100);
  }
  (*pcVar2)(local_360,local_360,0xd);
  bVar1 = piVar21[1];
  uVar22 = (uint)(char)bVar1;
  if ((int)uVar22 < 0) {
    auVar29._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar29._2_2_ = auVar29._0_2_;
    auVar29._4_2_ = auVar29._0_2_;
    auVar29._6_2_ = auVar29._0_2_;
    auVar29._8_2_ = auVar29._0_2_;
    auVar29._10_2_ = auVar29._0_2_;
    auVar29._12_2_ = auVar29._0_2_;
    auVar29._14_2_ = auVar29._0_2_;
    auVar29._16_2_ = auVar29._0_2_;
    auVar29._18_2_ = auVar29._0_2_;
    auVar29._20_2_ = auVar29._0_2_;
    auVar29._22_2_ = auVar29._0_2_;
    auVar29._24_2_ = auVar29._0_2_;
    auVar29._26_2_ = auVar29._0_2_;
    auVar29._28_2_ = auVar29._0_2_;
    auVar29._30_2_ = auVar29._0_2_;
    lVar23 = 0;
    do {
      auVar5 = vpaddsw_avx2(auVar29,*(undefined1 (*) [32])(local_360 + lVar23));
      auVar5 = vpsraw_avx2(auVar5,ZEXT416(-uVar22));
      *(undefined1 (*) [32])(local_360 + lVar23) = auVar5;
      lVar23 = lVar23 + 0x20;
    } while (lVar23 != 0x100);
  }
  else if (bVar1 != 0) {
    lVar23 = 0;
    do {
      auVar5 = vpsllw_avx2(*(undefined1 (*) [32])(local_360 + lVar23),ZEXT416(uVar22));
      *(undefined1 (*) [32])(local_360 + lVar23) = auVar5;
      lVar23 = lVar23 + 0x20;
    } while (lVar23 != 0x100);
  }
  auVar9 = vpunpcklwd_avx2(local_360,local_340);
  auVar10 = vpunpcklwd_avx2(local_320,local_300);
  auVar11 = vpunpcklwd_avx2(local_2e0,local_2c0);
  auVar12 = vpunpcklwd_avx2(local_2a0,local_280);
  auVar5 = vpunpckhwd_avx2(local_360,local_340);
  auVar6 = vpunpckhwd_avx2(local_320,local_300);
  auVar7 = vpunpckhwd_avx2(local_2e0,local_2c0);
  auVar8 = vpunpckhwd_avx2(local_2a0,local_280);
  auVar13 = vpunpckldq_avx2(auVar9,auVar10);
  auVar14 = vpunpckldq_avx2(auVar11,auVar12);
  auVar15 = vpunpckldq_avx2(auVar5,auVar6);
  auVar16 = vpunpckldq_avx2(auVar7,auVar8);
  auVar9 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar10 = vpunpckhdq_avx2(auVar11,auVar12);
  auVar5 = vpunpckhdq_avx2(auVar5,auVar6);
  auVar6 = vpunpckhdq_avx2(auVar7,auVar8);
  local_360 = vpunpcklqdq_avx2(auVar13,auVar14);
  local_340 = vpunpckhqdq_avx2(auVar13,auVar14);
  local_320 = vpunpcklqdq_avx2(auVar9,auVar10);
  local_300 = vpunpckhqdq_avx2(auVar9,auVar10);
  local_2e0 = vpunpcklqdq_avx2(auVar15,auVar16);
  local_2c0 = vpunpckhqdq_avx2(auVar15,auVar16);
  local_2a0 = vpunpcklqdq_avx2(auVar5,auVar6);
  local_280 = vpunpckhqdq_avx2(auVar5,auVar6);
  local_160._0_16_ = ZEXT116(0) * local_340._0_16_ + ZEXT116(1) * local_360._0_16_;
  local_160._16_16_ = ZEXT116(0) * local_360._16_16_ + ZEXT116(1) * local_340._0_16_;
  local_140._0_16_ = ZEXT116(0) * local_300._0_16_ + ZEXT116(1) * local_320._0_16_;
  local_140._16_16_ = ZEXT116(0) * local_320._16_16_ + ZEXT116(1) * local_300._0_16_;
  local_120._0_16_ = ZEXT116(0) * local_2c0._0_16_ + ZEXT116(1) * local_2e0._0_16_;
  local_120._16_16_ = ZEXT116(0) * local_2e0._16_16_ + ZEXT116(1) * local_2c0._0_16_;
  local_100._0_16_ = ZEXT116(0) * local_280._0_16_ + ZEXT116(1) * local_2a0._0_16_;
  local_100._16_16_ = ZEXT116(0) * local_2a0._16_16_ + ZEXT116(1) * local_280._0_16_;
  local_e0 = vperm2i128_avx2(local_360,local_340,0x31);
  local_c0 = vperm2i128_avx2(local_320,local_300,0x31);
  local_a0 = vperm2i128_avx2(local_2e0,local_2c0,0x31);
  local_80 = vperm2i128_avx2(local_2a0,local_280,0x31);
  if (bVar20) {
    lVar23 = 0x100;
    puVar24 = (undefined8 *)local_160;
    puVar26 = local_260;
    do {
      uVar17 = puVar24[1];
      *(undefined8 *)(local_280 + lVar23 + 0x10) = *puVar24;
      *(undefined8 *)(local_280 + lVar23 + 0x18) = uVar17;
      puVar24 = puVar24 + 2;
      lVar23 = lVar23 + -0x10;
    } while (lVar23 != 0);
  }
  else {
    puVar26 = local_160;
  }
  (*pcVar3)(puVar26,puVar26,0xd);
  bVar1 = piVar21[2];
  if ((char)bVar1 < '\0') {
    auVar31._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar31._2_2_ = auVar31._0_2_;
    auVar31._4_2_ = auVar31._0_2_;
    auVar31._6_2_ = auVar31._0_2_;
    auVar31._8_2_ = auVar31._0_2_;
    auVar31._10_2_ = auVar31._0_2_;
    auVar31._12_2_ = auVar31._0_2_;
    auVar31._14_2_ = auVar31._0_2_;
    lVar23 = 0;
    do {
      auVar27 = vpaddsw_avx(auVar31,*(undefined1 (*) [16])(puVar26 + lVar23));
      auVar27 = vpsraw_avx(auVar27,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [16])(puVar26 + lVar23) = auVar27;
      lVar23 = lVar23 + 0x10;
    } while (lVar23 != 0x100);
  }
  else if (bVar1 != 0) {
    lVar23 = 0;
    do {
      auVar31 = vpsllw_avx(*(undefined1 (*) [16])(puVar26 + lVar23),ZEXT416((uint)(int)(char)bVar1))
      ;
      *(undefined1 (*) [16])(puVar26 + lVar23) = auVar31;
      lVar23 = lVar23 + 0x10;
    } while (lVar23 != 0x100);
  }
  lVar23 = 0;
  auVar27._8_2_ = 1;
  auVar27._0_8_ = 0x1000100010001;
  auVar27._10_2_ = 1;
  auVar27._12_2_ = 1;
  auVar27._14_2_ = 1;
  auVar30._8_4_ = 0x80016a1;
  auVar30._0_8_ = 0x80016a1080016a1;
  auVar30._12_4_ = 0x80016a1;
  do {
    auVar31 = vpunpcklwd_avx(*(undefined1 (*) [16])(puVar26 + lVar23),auVar27);
    auVar4 = vpunpckhwd_avx(*(undefined1 (*) [16])(puVar26 + lVar23),auVar27);
    auVar31 = vpmaddwd_avx(auVar31,auVar30);
    auVar32 = vpsrad_avx(auVar31,0xc);
    auVar31 = vpmaddwd_avx(auVar4,auVar30);
    auVar31 = vpsrad_avx(auVar31,0xc);
    *(undefined1 (*) [16])((long)output + lVar23 * 2) = auVar32;
    *(undefined1 (*) [16])((long)output + lVar23 * 2 + 0x10) = auVar31;
    lVar23 = lVar23 + 0x10;
  } while (lVar23 != 0x100);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_16x8_avx2(const int16_t *input, int32_t *output,
                                       int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  __m256i buf2[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 8;
  const transform_1d_avx2 col_txfm = col_txfm16x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm16x8_arr[tx_type];
  __m128i *buf;
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input + 8 * 0, stride, buf0, height);
    load_buffer_16bit_to_16bit_flip(input + 8 * 1, stride, &buf0[8], height);
  } else {
    load_buffer_16bit_to_16bit(input + 8 * 0, stride, buf0, height);
    load_buffer_16bit_to_16bit(input + 8 * 1, stride, &buf0[8], height);
  }
  pack_reg(buf0, &buf0[8], buf2);
  round_shift_16bit_w16_avx2(buf2, height, shift[0]);
  col_txfm(buf2, buf2, cos_bit_col);
  round_shift_16bit_w16_avx2(buf2, height, shift[1]);
  transpose_16bit_16x8_avx2(buf2, buf2);
  extract_reg(buf2, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w8(buf, output, height, width);
}